

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O1

void __thiscall ezc3d::DataNS::Points3dNS::Point::print(Point *this)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  double extraout_XMM0_Qa;
  
  Vector3d::print(&this->super_Vector3d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Residual = ",0xb);
  (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x28])(this);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; Masks = [",0xb);
  lVar2 = (ulong)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
  if (lVar2 != 1) {
    uVar4 = 0;
    do {
      poVar1 = std::ostream::_M_insert<bool>(true);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      uVar4 = uVar4 + 1;
      uVar3 = (ulong)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      lVar2 = (long)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    } while (uVar4 < (uVar3 + lVar2 * 8) - 1);
    lVar2 = uVar3 + lVar2 * 8;
  }
  if (lVar2 != 0) {
    poVar1 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return;
}

Assistant:

void ezc3d::DataNS::Points3dNS::Point::print() const {
  ezc3d::Vector3d::print();
  std::cout << "Residual = " << residual() << "; Masks = [";
  for (size_t i = 0; i < _cameraMasks.size() - 1; ++i) {
    std::cout << _cameraMasks[i] << ", ";
  }
  if (_cameraMasks.size() > 0) {
    std::cout << _cameraMasks[_cameraMasks.size() - 1] << "]";
  }
  std::cout << "\n";
}